

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parser::FinishFncNode(Parser *this,ParseNodeFnc *pnodeFnc,bool fAllowIn)

{
  Scanner_t *this_00;
  FncFlags FVar1;
  tokens tVar2;
  uint uVar3;
  uint uVar4;
  LocalFunctionId *pLVar5;
  ParseNodeFnc *pPVar6;
  int32 *piVar7;
  uint *puVar8;
  IdentPtr pIVar9;
  code *pcVar10;
  ParseNodeFnc *pPVar11;
  bool bVar12;
  charcount_t cVar13;
  undefined4 *puVar14;
  IdentPtr pIVar15;
  char *message;
  undefined7 in_register_00000011;
  char *error;
  uint lineNumber;
  byte bVar16;
  LocalFunctionId local_58;
  undefined4 local_54;
  LocalFunctionId tempNextFunctionId;
  size_t local_48;
  ParseNodeFnc *local_40;
  bool local_31;
  
  if (pnodeFnc == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1cfb,"(pnodeFnc)","pnodeFnc");
    if (!bVar12) goto LAB_00e82f97;
    *puVar14 = 0;
  }
  local_54 = (undefined4)CONCAT71(in_register_00000011,fAllowIn);
  pLVar5 = this->m_nextFunctionId;
  local_58 = pnodeFnc->functionId + 1;
  this->m_nextFunctionId = &local_58;
  pPVar6 = this->m_currentNodeFunc;
  piVar7 = this->m_pCurrentAstSize;
  puVar8 = this->m_pnestedCount;
  this->m_currentNodeFunc = pnodeFnc;
  this->m_pCurrentAstSize = &pnodeFnc->astSize;
  pnodeFnc->nestedCount = 0;
  this->m_pnestedCount = &pnodeFnc->nestedCount;
  FVar1 = pnodeFnc->fncFlags;
  this_00 = &this->m_scan;
  local_48 = CONCAT44(local_48._4_4_,FVar1);
  local_40 = pnodeFnc;
  if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (this_00,(pnodeFnc->super_ParseNode).ichMin,pnodeFnc->lineNumber);
    if ((FVar1 >> 0x11 & 1) == 0) {
      if ((pnodeFnc->fncFlags & kFunctionIsAccessor) == kFunctionNone) {
        if ((FVar1 >> 0xd & 1) == 0) {
          _tempNextFunctionId = (Token *)&this->m_token;
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00e82dea:
          do {
            Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
            if ((((this->m_token).tk == tkID) && (((this->m_scan).field_0x508 & 0x10) == 0)) &&
               (pIVar9 = (this->wellKnownPropertyPids).async,
               pIVar15 = Token::GetIdentifier(_tempNextFunctionId,&(this->m_scan).m_htbl),
               pIVar15 == pIVar9)) goto LAB_00e82e81;
            tVar2 = (this->m_token).tk;
          } while ((tVar2 == tkStar) || (tVar2 == tkLParen));
          if (tVar2 != tkFUNCTION) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            lineNumber = 0x1d49;
            error = "(m_token.tk == tkLParen || m_token.tk == tkStar)";
            message = "m_token.tk == tkLParen || m_token.tk == tkStar";
            goto LAB_00e82e67;
          }
        }
      }
      else {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
      }
    }
    else {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        while( true ) {
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          tVar2 = (this->m_token).tk;
          if (tVar2 != tkLBrack) break;
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
          if ((this->m_token).tk != tkRBrack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x1d2a,"(m_token.tk == tkRBrack)","m_token.tk == tkRBrack");
            if (!bVar12) goto LAB_00e82f97;
            *puVar14 = 0;
          }
        }
      } while (tVar2 != tkLParen);
    }
  }
  else {
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (this_00,(pnodeFnc->pnodeName->super_ParseNode).ichLim,pnodeFnc->lineNumber);
  }
  pPVar11 = local_40;
  bVar16 = (byte)(local_40->fncFlags >> 0x18);
  uVar3 = (uint)local_48;
  _tempNextFunctionId =
       (Token *)CONCAT71(stack0xffffffffffffffb1,(this->m_scan).m_fYieldIsKeywordRegion);
  local_31 = (this->m_scan).m_fAwaitIsKeywordRegion;
  (this->m_scan).m_fYieldIsKeywordRegion = (bool)(bVar16 >> 1 & 1);
  (this->m_scan).m_fAwaitIsKeywordRegion = (bool)(bVar16 >> 4 & 1);
  if (((uint)local_48 >> 0x11 & 1) == 0) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  if ((this->m_token).tk == tkStar) {
    if ((pPVar11->fncFlags & kFunctionIsGenerator) == kFunctionNone) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1d5b,"(pnodeFnc->IsGenerator())","pnodeFnc->IsGenerator()");
      if (!bVar12) goto LAB_00e82f97;
      *puVar14 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
  }
  if ((((uVar3 >> 0xd & 1) != 0) && ((this->m_token).tk == tkID)) &&
     ((((this->m_scan).field_0x508 & 0x10) == 0 &&
      (pIVar9 = (this->wellKnownPropertyPids).async,
      pIVar15 = Token::GetIdentifier((Token *)&this->m_token,&(this->m_scan).m_htbl),
      pIVar15 == pIVar9)))) {
    if ((pPVar11->fncFlags & kFunctionIsAsync) == kFunctionNone) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1d60,"(pnodeFnc->IsAsync())","pnodeFnc->IsAsync()");
      if (!bVar12) goto LAB_00e82f97;
      *puVar14 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
  }
  tVar2 = (this->m_token).tk;
  bVar16 = (byte)(uVar3 >> 0xd);
  if ((tVar2 != tkLParen) && ((tVar2 == tkID & bVar16) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1d63,"(m_token.tk == tkLParen || (fLambda && m_token.tk == tkID))",
                        "m_token.tk == tkLParen || (fLambda && m_token.tk == tkID)");
    if (!bVar12) goto LAB_00e82f97;
    *puVar14 = 0;
  }
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
  tVar2 = (this->m_token).tk;
  if ((tVar2 != tkRParen) && (tVar2 != tkDArrow)) {
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((this->m_token).tk == tkEllipsis) {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
      }
      tVar2 = (this->m_token).tk;
      if ((tVar2 == tkLBrack) || (tVar2 == tkLCurly)) {
        ParseDestructuredLiteralWithScopeSave(this,tkLET,false,false,DIC_None,true);
      }
      else if (tVar2 == tkID) {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
        if ((this->m_token).tk == tkAsg) {
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          ParseExpr<false>(this,1,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x1d80,"(false)",
                            "Unexpected identifier prefix while fast-scanning formals");
        if (!bVar12) goto LAB_00e82f97;
        *puVar14 = 0;
      }
    } while (((this->m_token).tk == tkComma) &&
            ((Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00),
             (this->m_token).tk != tkRParen ||
             (((this->m_scriptContext->config).threadConfig)->m_ES7TrailingComma != true))));
  }
  if ((this->m_token).tk == tkRParen) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  pPVar11 = local_40;
  if ((((uint)local_48 >> 0xd & 1) != 0) && ((this->m_token).tk == tkDArrow)) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  uVar3 = (pPVar11->super_ParseNode).ichLim;
  local_48 = pPVar11->cbLim;
  FinishFncDecl(this,pPVar11,(LPCOLESTR)0x0,(bool)(bVar16 & 1),false,local_54._0_1_);
  uVar4 = (pPVar11->super_ParseNode).ichLim;
  if (uVar4 != uVar3) {
    if (uVar3 <= uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1da8,"(pnodeFnc->ichLim < ichLim)","pnodeFnc->ichLim < ichLim");
      if (!bVar12) goto LAB_00e82f97;
      *puVar14 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (this_00,(local_40->super_ParseNode).ichLim,0);
    cVar13 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(this_00);
    if (cVar13 != uVar3) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
        if ((this->m_token).tk != tkRParen) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x1dad,"(m_token.tk == tkRParen)","m_token.tk == tkRParen");
          if (!bVar12) goto LAB_00e82f97;
          *puVar14 = 0;
        }
        cVar13 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(this_00);
      } while (cVar13 != uVar3);
    }
  }
  pPVar11 = local_40;
  (local_40->super_ParseNode).ichLim = uVar3;
  local_40->cbLim = local_48;
  this->m_currentNodeFunc = pPVar6;
  this->m_pCurrentAstSize = piVar7;
  this->m_pnestedCount = puVar8;
  if (puVar8 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1db8,"(m_pnestedCount)","m_pnestedCount");
    if (!bVar12) goto LAB_00e82f97;
    *puVar14 = 0;
  }
  if (local_58 != pPVar11->deferredParseNextFunctionId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1dba,"(tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId)",
                        "tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId");
    if (!bVar12) {
LAB_00e82f97:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar14 = 0;
  }
  this->m_nextFunctionId = pLVar5;
  (this->m_scan).m_fYieldIsKeywordRegion = tempNextFunctionId._0_1_;
  (this->m_scan).m_fAwaitIsKeywordRegion = local_31;
  return;
LAB_00e82e81:
  if ((local_40->fncFlags & kFunctionIsAsync) == kFunctionNone) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar14 = 1;
    lineNumber = 0x1d41;
    error = "(pnodeFnc->IsAsync())";
    message = "pnodeFnc->IsAsync()";
LAB_00e82e67:
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,lineNumber,error,message);
    if (bVar12) {
      *puVar14 = 0;
      goto LAB_00e82dea;
    }
    goto LAB_00e82f97;
  }
  goto LAB_00e82dea;
}

Assistant:

void Parser::FinishFncNode(ParseNodeFnc * pnodeFnc, bool fAllowIn)
{
    AnalysisAssert(pnodeFnc);

    // Finish the AST for a function that was deferred earlier, but which we decided
    // to finish after the fact.
    // We assume that the name(s) and arg(s) have already got parse nodes, so
    // we just have to do the function body.

    // Save the current next function Id, and resume from the old one.
    Js::LocalFunctionId * nextFunctionIdSave = m_nextFunctionId;
    Js::LocalFunctionId tempNextFunctionId = pnodeFnc->functionId + 1;
    this->m_nextFunctionId = &tempNextFunctionId;

    ParseNodeFnc * pnodeFncSave = m_currentNodeFunc;
    uint *pnestedCountSave = m_pnestedCount;
    int32* pAstSizeSave = m_pCurrentAstSize;

    m_currentNodeFunc = pnodeFnc;
    m_pCurrentAstSize = &(pnodeFnc->astSize);

    pnodeFnc->nestedCount = 0;
    m_pnestedCount = &pnodeFnc->nestedCount;

    bool fLambda = pnodeFnc->IsLambda();
    bool fMethod = pnodeFnc->IsMethod();

    // Cue up the parser to the start of the function body.
    if (pnodeFnc->pnodeName)
    {
        // Skip the name(s).
        this->GetScanner()->SetCurrentCharacter(pnodeFnc->pnodeName->ichLim, pnodeFnc->lineNumber);
    }
    else
    {
        this->GetScanner()->SetCurrentCharacter(pnodeFnc->ichMin, pnodeFnc->lineNumber);

        if (fMethod)
        {
            // Method. Skip identifier name, computed property name, "async", "get", "set", and '*' or '(' characters.
            for (;;)
            {
                this->GetScanner()->Scan();
                // '[' character indicates a computed property name for this method. We should consume it.
                if (m_token.tk == tkLBrack)
                {
                    // We don't care what the name expr is.
                    this->GetScanner()->Scan();
                    ParseExpr<false>();
                    Assert(m_token.tk == tkRBrack);
                    continue;
                }
                // Quit scanning ahead when we reach a '(' character which opens the arg list.
                if (m_token.tk == tkLParen)
                {
                    break;
                }
            }
        }
        else if (pnodeFnc->IsAccessor())
        {
            // Getter/setter. The node text starts with the name, so eat that.
            this->GetScanner()->ScanNoKeywords();
        }
        else if (!fLambda)
        {
            // Anonymous function. Skip "async", "function", and '(' or '*' characters.
            for (;;)
            {
                this->GetScanner()->Scan();
                if (CheckContextualKeyword(wellKnownPropertyPids.async))
                {
                    Assert(pnodeFnc->IsAsync());
                    continue;
                }
                // Quit scanning ahead when we reach a 'function' keyword which precedes the arg list.
                if (m_token.tk == tkFUNCTION)
                {
                    break;
                }
                Assert(m_token.tk == tkLParen || m_token.tk == tkStar);
            }
        }
    }

    // switch scanner to treat 'yield' as keyword in generator functions
    // or as an identifier in non-generator functions
    bool fPreviousYieldIsKeyword = this->GetScanner()->SetYieldIsKeywordRegion(pnodeFnc && pnodeFnc->IsGenerator());
    bool fPreviousAwaitIsKeyword = this->GetScanner()->SetAwaitIsKeywordRegion(pnodeFnc && pnodeFnc->IsAsync());

    // Skip the arg list.
    if (!fMethod)
    {
        // If this is a method, we've already advanced to the '(' token.
        this->GetScanner()->Scan();
    }
    if (m_token.tk == tkStar)
    {
        Assert(pnodeFnc->IsGenerator());
        this->GetScanner()->ScanNoKeywords();
    }
    if (fLambda && CheckContextualKeyword(wellKnownPropertyPids.async))
    {
        Assert(pnodeFnc->IsAsync());
        this->GetScanner()->ScanNoKeywords();
    }
    Assert(m_token.tk == tkLParen || (fLambda && m_token.tk == tkID));
    this->GetScanner()->ScanNoKeywords();

    if (m_token.tk != tkRParen && m_token.tk != tkDArrow)
    {
        for (;;)
        {
            if (m_token.tk == tkEllipsis)
            {
                this->GetScanner()->ScanNoKeywords();
            }

            if (m_token.tk == tkID)
            {
                this->GetScanner()->ScanNoKeywords();

                if (m_token.tk == tkAsg)
                {
                    // Eat the default expression
                    this->GetScanner()->Scan();
                    ParseExpr<false>(koplCma);
                }
            }
            else if (IsPossiblePatternStart())
            {
                ParseDestructuredLiteralWithScopeSave(tkLET, false/*isDecl*/, false /*topLevel*/);
            }
            else
            {
                AssertMsg(false, "Unexpected identifier prefix while fast-scanning formals");
            }

            if (m_token.tk != tkComma)
            {
                break;
            }
            this->GetScanner()->ScanNoKeywords();

            if (m_token.tk == tkRParen && m_scriptContext->GetConfig()->IsES7TrailingCommaEnabled())
            {
                break;
            }
        }
    }

    if (m_token.tk == tkRParen)
    {
        this->GetScanner()->Scan();
    }
    if (fLambda && m_token.tk == tkDArrow)
    {
        this->GetScanner()->Scan();
    }

    // Finish the function body.
    {
        // Note that in IE8- modes, surrounding parentheses are considered part of function body. e.g. "( function x(){} )".
        // We lose that context here since we start from middle of function body. So save and restore source range info.
        const charcount_t ichLim = pnodeFnc->ichLim;
        const size_t cbLim = pnodeFnc->cbLim;

        this->FinishFncDecl(pnodeFnc, NULL, fLambda, /* skipCurlyBraces */ false, fAllowIn);

#if DBG
        // The pnode extent may not match the original extent.
        // We expect this to happen only when there are trailing ")"'s.
        // Consume them and make sure that's all we've got.
        if (pnodeFnc->ichLim != ichLim)
        {
            Assert(pnodeFnc->ichLim < ichLim);
            this->GetScanner()->SetCurrentCharacter(pnodeFnc->ichLim);
            while (this->GetScanner()->IchLimTok() != ichLim)
            {
                this->GetScanner()->ScanNoKeywords();
                Assert(m_token.tk == tkRParen);
            }
        }
#endif
        pnodeFnc->ichLim = ichLim;
        pnodeFnc->cbLim = cbLim;
    }

    m_currentNodeFunc = pnodeFncSave;
    m_pCurrentAstSize = pAstSizeSave;
    m_pnestedCount = pnestedCountSave;
    Assert(m_pnestedCount);

    Assert(tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId);
    this->m_nextFunctionId = nextFunctionIdSave;

    this->GetScanner()->SetYieldIsKeywordRegion(fPreviousYieldIsKeyword);
    this->GetScanner()->SetAwaitIsKeywordRegion(fPreviousAwaitIsKeyword);
}